

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

uint __thiscall IDisk::GetTrackInfo(IDisk *this,MFMTrack *mfm_track,Track *track_buffer)

{
  pointer *ppaVar1;
  pointer paVar2;
  uchar *puVar3;
  iterator __position;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte b;
  ILog *pIVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  uint uVar17;
  int data_count;
  uint uVar18;
  int iVar19;
  uint uVar20;
  CRC crc_local;
  anon_struct_36_14_4aa84ee9 local_80;
  uint local_5c;
  CRC local_58;
  
  CRC::CRC(&local_58);
  uVar5 = mfm_track->size;
  uVar7 = 0;
  if (0x3f < uVar5) {
    uVar7 = 0x40;
    if (uVar5 != 0x40) {
      uVar20 = 0;
      uVar4 = 0;
      uVar7 = uVar5;
      do {
        if (uVar4 < 0x51) {
LAB_00162a75:
          uVar4 = uVar4 + 1;
        }
        else {
          puVar3 = mfm_track->bitfield;
          iVar15 = bcmp(&DAT_001a7c70,puVar3 + uVar4,0x40);
          if (iVar15 != 0) goto LAB_00162a75;
          uVar8 = 0xffffffffffffffff;
          uVar5 = uVar4 - 0x50;
          do {
            if ((puVar3[uVar5] != '\x01') || (puVar3[uVar5 + 1] != '\0')) goto LAB_00162a75;
            uVar5 = uVar5 + 2;
            uVar8 = uVar8 + 1;
          } while (uVar8 < 0x27);
          CRC::Reset(&local_58);
          CRC::AddByteToCrc(&local_58,0xa1);
          CRC::AddByteToCrc(&local_58,0xa1);
          CRC::AddByteToCrc(&local_58,0xa1);
          CRC::AddByteToCrc(&local_58,0xfe);
          local_80.dam_sync_offset = 0;
          local_80.data_crc_ok = false;
          local_80._29_3_ = 0;
          local_80.index_end = 0;
          local_80.real_size = 0;
          local_80._18_2_ = 0;
          local_80.dam_offset = 0;
          uVar5 = uVar4 + 0x41;
          uVar7 = 0xfffffffe;
          local_80.c = 0;
          do {
            uVar17 = mfm_track->size;
            if (uVar5 < mfm_track->size) {
              uVar17 = uVar20;
            }
            local_80.c = mfm_track->bitfield[uVar5 - uVar17] & 1 | local_80.c * '\x02';
            uVar5 = (uVar5 - uVar17) + 2;
            uVar7 = uVar7 + 2;
          } while (uVar7 < 0xe);
          local_80._9_7_ = 0;
          local_80.idam_offset = uVar4;
          local_80.idam_sync_offset = uVar4 - 0x50;
          CRC::AddByteToCrc(&local_58,local_80.c);
          uVar5 = uVar4 + 0x51;
          uVar7 = 0xfffffffe;
          bVar9 = 0;
          do {
            uVar17 = mfm_track->size;
            if (uVar5 < mfm_track->size) {
              uVar17 = uVar20;
            }
            bVar9 = mfm_track->bitfield[uVar5 - uVar17] & 1 | bVar9 * '\x02';
            uVar5 = (uVar5 - uVar17) + 2;
            uVar7 = uVar7 + 2;
          } while (uVar7 < 0xe);
          local_80.h = bVar9;
          CRC::AddByteToCrc(&local_58,bVar9);
          uVar5 = uVar4 + 0x61;
          uVar7 = 0xfffffffe;
          bVar9 = 0;
          do {
            uVar17 = mfm_track->size;
            if (uVar5 < mfm_track->size) {
              uVar17 = uVar20;
            }
            bVar9 = mfm_track->bitfield[uVar5 - uVar17] & 1 | bVar9 * '\x02';
            uVar5 = (uVar5 - uVar17) + 2;
            uVar7 = uVar7 + 2;
          } while (uVar7 < 0xe);
          local_80.r = bVar9;
          CRC::AddByteToCrc(&local_58,bVar9);
          uVar5 = uVar4 + 0x71;
          uVar7 = 0xfffffffe;
          bVar9 = 0;
          do {
            uVar17 = mfm_track->size;
            if (uVar5 < mfm_track->size) {
              uVar17 = uVar20;
            }
            bVar9 = mfm_track->bitfield[uVar5 - uVar17] & 1 | bVar9 * '\x02';
            uVar5 = (uVar5 - uVar17) + 2;
            uVar7 = uVar7 + 2;
          } while (uVar7 < 0xe);
          local_80.n = bVar9;
          CRC::AddByteToCrc(&local_58,bVar9);
          pIVar10 = this->log_;
          if (pIVar10 != (ILog *)0x0) {
            (*(code *)**(undefined8 **)pIVar10)(pIVar10,"CHRN Found");
            pIVar10 = this->log_;
            if (pIVar10 != (ILog *)0x0) {
              (**(code **)(*(long *)pIVar10 + 8))(pIVar10,local_80._8_8_ & 0xff);
              pIVar10 = this->log_;
              if (pIVar10 != (ILog *)0x0) {
                (**(code **)(*(long *)pIVar10 + 8))(pIVar10,local_80.h);
                pIVar10 = this->log_;
                if (pIVar10 != (ILog *)0x0) {
                  (**(code **)(*(long *)pIVar10 + 8))(pIVar10,local_80.r);
                  pIVar10 = this->log_;
                  if (pIVar10 != (ILog *)0x0) {
                    (**(code **)(*(long *)pIVar10 + 8))(pIVar10,local_80.n);
                  }
                }
              }
            }
          }
          uVar5 = uVar4 + 0x81;
          uVar7 = mfm_track->size;
          uVar18 = 0xfffffffe;
          uVar17 = 0;
          do {
            uVar11 = uVar7;
            if (uVar5 < uVar7) {
              uVar11 = uVar20;
            }
            uVar17 = (uint)(byte)((char)uVar17 * '\x02') | mfm_track->bitfield[uVar5 - uVar11] & 1;
            uVar5 = (uVar5 - uVar11) + 2;
            uVar18 = uVar18 + 2;
          } while (uVar18 < 0xe);
          uVar5 = uVar4 + 0x91;
          uVar11 = 0xfffffffe;
          uVar18 = 0;
          do {
            uVar13 = uVar7;
            if (uVar5 < uVar7) {
              uVar13 = uVar20;
            }
            uVar18 = (uint)(byte)((char)uVar18 * '\x02') | mfm_track->bitfield[uVar5 - uVar13] & 1;
            uVar5 = (uVar5 - uVar13) + 2;
            uVar11 = uVar11 + 2;
          } while (uVar11 < 0xe);
          uVar18 = uVar18 | uVar17 << 8;
          pIVar10 = this->log_;
          if ((unsigned_short)uVar18 == local_58.computed_crc_) {
LAB_00162da4:
            if (pIVar10 != (ILog *)0x0) {
              (**(code **)(*(long *)pIVar10 + 0x20))();
            }
          }
          else {
            local_80._8_8_ = local_80._8_8_ | 0x200000000000;
            if (pIVar10 != (ILog *)0x0) {
              (*(code *)**(undefined8 **)pIVar10)(pIVar10,"HEADER CRC ERROR !");
              pIVar10 = this->log_;
              goto LAB_00162da4;
            }
          }
          uVar4 = uVar4 + 0xa0;
          uVar7 = mfm_track->size;
          if (uVar4 < uVar7 - 0x38) {
            do {
              iVar15 = bcmp(&DAT_001a7c30,mfm_track->bitfield + uVar4,0x38);
              if (iVar15 == 0) {
                local_80.dam_sync_offset = uVar4 - 0x50;
                local_80.dam_offset = uVar4;
                CRC::Reset(&local_58);
                CRC::AddByteToCrc(&local_58,0xa1);
                CRC::AddByteToCrc(&local_58,0xa1);
                CRC::AddByteToCrc(&local_58,0xa1);
                uVar5 = uVar4 + 0x31;
                uVar7 = 0xfffffffe;
                bVar9 = 0;
                do {
                  uVar17 = mfm_track->size;
                  if (uVar5 < mfm_track->size) {
                    uVar17 = uVar20;
                  }
                  bVar9 = mfm_track->bitfield[uVar5 - uVar17] & 1 | bVar9 * '\x02';
                  uVar5 = (uVar5 - uVar17) + 2;
                  uVar7 = uVar7 + 2;
                } while (uVar7 < 0xe);
                CRC::AddByteToCrc(&local_58,bVar9);
                if (bVar9 == 0xf8) {
                  local_80._8_8_ = local_80._8_8_ | 0x40000000000000;
                }
                uVar4 = uVar4 + 0x40;
                bVar9 = local_80.n;
                if (7 < local_80.n) {
                  bVar9 = 8;
                }
                uVar5 = mfm_track->size;
                iVar19 = 0;
                local_5c = uVar18;
                do {
                  uVar7 = uVar4 + 1;
                  uVar17 = 0xfffffffe;
                  b = 0;
                  do {
                    uVar18 = uVar5;
                    if (uVar7 < uVar5) {
                      uVar18 = 0;
                    }
                    b = mfm_track->bitfield[uVar7 - uVar18] & 1 | b * '\x02';
                    uVar7 = (uVar7 - uVar18) + 2;
                    uVar17 = uVar17 + 2;
                  } while (uVar17 < 0xe);
                  CRC::AddByteToCrc(&local_58,b);
                  uVar5 = mfm_track->size;
                  uVar7 = uVar5;
                  if (uVar4 + 0x10 < uVar5) {
                    uVar7 = uVar20;
                  }
                  local_80.real_size = local_80.real_size + 1;
                  uVar4 = (uVar4 + 0x10) - uVar7;
                  iVar19 = iVar19 + 1;
                } while (iVar19 != 0x80 << (bVar9 & 0x1f));
                uVar18 = local_5c;
                if (uVar4 < uVar5 - 0x20) {
                  uVar7 = uVar4 + 1;
                  uVar18 = 0xfffffffe;
                  uVar17 = 0;
                  do {
                    uVar11 = uVar5;
                    if (uVar7 < uVar5) {
                      uVar11 = uVar20;
                    }
                    uVar17 = (uint)(byte)((char)uVar17 * '\x02') |
                             mfm_track->bitfield[uVar7 - uVar11] & 1;
                    uVar7 = (uVar7 - uVar11) + 2;
                    uVar18 = uVar18 + 2;
                  } while (uVar18 < 0xe);
                  uVar7 = uVar4 + 0x11;
                  uVar11 = 0xfffffffe;
                  uVar18 = 0;
                  do {
                    uVar13 = uVar5;
                    if (uVar7 < uVar5) {
                      uVar13 = uVar20;
                    }
                    uVar18 = (uint)(byte)((char)uVar18 * '\x02') |
                             mfm_track->bitfield[uVar7 - uVar13] & 1;
                    uVar7 = (uVar7 - uVar13) + 2;
                    uVar11 = uVar11 + 2;
                  } while (uVar11 < 0xe);
                  uVar4 = uVar4 + 0x20;
                  uVar18 = uVar18 | uVar17 << 8;
                }
                if ((unsigned_short)uVar18 == local_58.computed_crc_) {
LAB_00162ff6:
                  if (this->log_ != (ILog *)0x0) {
                    (**(code **)(*(long *)this->log_ + 0x20))();
                  }
                }
                else {
                  local_80._8_8_ = local_80._8_8_ | 0x20200000000000;
                  pIVar10 = this->log_;
                  if (pIVar10 != (ILog *)0x0) {
                    (*(code *)**(undefined8 **)pIVar10)(pIVar10,"DATA CRC ERROR !");
                    goto LAB_00162ff6;
                  }
                }
                __position._M_current =
                     (track_buffer->list_sector_).
                     super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_80.index_end = uVar4;
                if (__position._M_current ==
                    (track_buffer->list_sector_).
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<IDisk::Sector,std::allocator<IDisk::Sector>>::
                  _M_realloc_insert<IDisk::Sector_const&>
                            ((vector<IDisk::Sector,std::allocator<IDisk::Sector>> *)track_buffer,
                             __position,&local_80);
                }
                else {
                  (__position._M_current)->index_end = uVar4;
                  (__position._M_current)->real_size = local_80.real_size;
                  *(undefined2 *)&(__position._M_current)->field_0x12 = local_80._18_2_;
                  (__position._M_current)->dam_offset = local_80.dam_offset;
                  (__position._M_current)->dam_sync_offset = local_80.dam_sync_offset;
                  (__position._M_current)->data_crc_ok = (bool)local_80.data_crc_ok;
                  *(int3 *)&(__position._M_current)->field_0x1d = local_80._29_3_;
                  (__position._M_current)->idam_offset = local_80.idam_offset;
                  (__position._M_current)->idam_sync_offset = local_80.idam_sync_offset;
                  (__position._M_current)->c = local_80.c;
                  (__position._M_current)->h = local_80.h;
                  (__position._M_current)->r = local_80.r;
                  (__position._M_current)->n = local_80.n;
                  (__position._M_current)->chrn_crc_ok = local_80.chrn_crc_ok;
                  (__position._M_current)->status1 = local_80.status1;
                  (__position._M_current)->status2 = local_80.status2;
                  (__position._M_current)->field_0xf = local_80._15_1_;
                  ppaVar1 = &(track_buffer->list_sector_).
                             super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                uVar4 = local_80.dam_offset + 0x41;
                uVar7 = mfm_track->size;
              }
              else {
                uVar4 = uVar4 + 1;
              }
            } while ((uVar4 < uVar7 - 0x38) && (iVar15 != 0));
          }
        }
      } while (uVar4 < uVar7 - 0x40);
    }
    paVar2 = (track_buffer->list_sector_).
             super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(track_buffer->list_sector_).
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar2;
    if (lVar6 == 0) {
      uVar5 = 0;
      uVar7 = 0x100;
    }
    else {
      uVar8 = (lVar6 >> 2) * -0x71c71c71c71c71c7;
      puVar12 = &paVar2->index_end;
      uVar14 = 0;
      uVar4 = 0x100;
      bVar16 = false;
      uVar5 = 0;
      uVar20 = 0;
      iVar15 = 0;
      do {
        if (uVar14 != 0) {
          iVar15 = (iVar15 - uVar20) + ((anon_struct_36_14_4aa84ee9 *)(puVar12 + -8))->idam_offset +
                   -0x18;
        }
        uVar20 = puVar12[-3];
        uVar18 = (uint)*(ushort *)(puVar12 + -4);
        uVar17 = uVar18 * 0x10 + uVar20 + 0x24;
        if ((uVar17 <= uVar5) || ((bool)(0xffff < uVar18 + uVar4 | bVar16))) {
          if (uVar14 < uVar8 - 1 && 1 < uVar8) {
            iVar19 = paVar2[(int)uVar14 + 1].idam_offset;
            uVar11 = iVar19 + 0xa0;
            if (uVar11 < uVar17) {
              *puVar12 = uVar11;
              uVar18 = (iVar19 - uVar20) + 0x70 >> 4;
              *(unsigned_short *)(puVar12 + -4) = (unsigned_short)uVar18;
            }
          }
          else {
            uVar18 = ((uVar7 + 100) - uVar20) + paVar2->idam_offset >> 4;
            *(unsigned_short *)(puVar12 + -4) = (unsigned_short)uVar18;
          }
        }
        else {
          bVar16 = uVar7 < uVar17;
          if (uVar7 < uVar17) {
            uVar18 = (uVar7 - uVar20) + paVar2->idam_offset + 0x1c >> 4;
            *(unsigned_short *)(puVar12 + -4) = (unsigned_short)uVar18;
          }
          uVar5 = *puVar12;
        }
        uVar4 = uVar4 + (uVar18 & 0xffff);
        bVar16 = (bool)(bVar16 | uVar7 < (uVar18 & 0xffff) * 0x10 + uVar20 + 0x24);
        uVar20 = *puVar12;
        uVar14 = uVar14 + 1;
        puVar12 = puVar12 + 9;
      } while ((uVar14 & 0xffffffff) <= uVar8 && uVar8 - (uVar14 & 0xffffffff) != 0);
      iVar19 = iVar15 + 0xf;
      if (-1 < iVar15) {
        iVar19 = iVar15;
      }
      track_buffer->gap3_size_ = (int)((ulong)(long)(iVar19 >> 4) / uVar8);
      uVar5 = uVar4 + 0x100;
      uVar7 = uVar4 + 0x100;
      if ((char)uVar4 == '\0') {
        uVar5 = uVar4;
        uVar7 = uVar4;
      }
    }
    track_buffer->full_size_ = uVar5;
  }
  CRC::~CRC(&local_58);
  return uVar7;
}

Assistant:

unsigned int IDisk::GetTrackInfo(MFMTrack* mfm_track, Track* track_buffer)
{
   unsigned int size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   if (mfm_track->size < (int)sizeof(pattern_fe))
   {
      return 0;
   }
   while (index < mfm_track->size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > SYNC_BIT_NUMBER * 2);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &mfm_track->bitfield[index], sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }

      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("CHRN Found");
         LOGB(sector.c );
         LOGB(sector.h );
         LOGB(sector.r );
         LOGB(sector.n );

         // Do we have CRC error ?
         unsigned short crc = GetNextByte(mfm_track, index);
         crc <<= 8;
         index += 16;
         crc |= GetNextByte(mfm_track, index);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < mfm_track->size - (int)sizeof(pattern_f)) && (!data_found))
         {
            if (memcmp(pattern_f, &mfm_track->bitfield[index], sizeof(pattern_f)) == 0)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2; // todo : Add verify

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByte(mfm_track, index);
               crc_local.AddByteToCrc(byte);
               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sectorsize = (0x80 << (std::min(sector.n, (unsigned char)0x8)));
               for (int data_count = 0;
                    data_count < sectorsize; data_count++)
               {
                  byte = GetNextByte(mfm_track, index);
                  crc_local.AddByteToCrc(byte);
                  index += 16;
                  if (index >= mfm_track->size)
                  {
                     index = index - mfm_track->size;
                  }

                  sector.real_size++;
               }
               if (index < mfm_track->size - 32)
               {
                  // CRC Check
                  crc = GetNextByte(mfm_track, index);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByte(mfm_track, index);
                  index += 16;
               }
               else
               {
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               index = sector.dam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   unsigned int offset_end = 0;
   unsigned int max_index = 0;
   bool whole_track_recorded = false;
   unsigned int finalsize = 256;

   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }

         // check size :
         //if ( track_buffer->listSector.size() > 1 && i < track_buffer->listSector.size()-1 )
         {
            // Interlaced sector :
            // Add full sector if :
            // - MaxIndex < endIndex (AND whole track is not recorded)
            // - totalsize + RealSize < 0x10000 (otherwise = problem with dsk header)
            if (max_index < track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16
               && !whole_track_recorded
               && (finalsize + track_buffer->list_sector_[i].real_size) < 0x10000)
            {
               if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
               {
                  // Skip to first IDAM found
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - (track_buffer->list_sector_[i
                  ].dam_offset + 0x24) + track_buffer->list_sector_[0].idam_offset + 64) / 16);
                  whole_track_recorded = true;
               }
               max_index = track_buffer->list_sector_[i].index_end;
            }
               // Otherwise :
               // Add until IDAMOffset + 160 bye ( 4 for idam, 4 for chrn, 4 for CRC)
            else
            {
               if (track_buffer->list_sector_.size() > 1 && i < track_buffer->list_sector_.size() - 1)
               {
                  if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > track_buffer->
                     list_sector_[i + 1].idam_offset + 160)
                  {
                     //track_buffer->listSector[i].RealSize -= (track_buffer->listSector[i].indexEnd - (track_buffer->listSector[i+1].IDAMOffset + 160))/16;
                     track_buffer->list_sector_[i].index_end = track_buffer->list_sector_[i + 1].idam_offset + 160;
                     track_buffer->list_sector_[i].real_size = (track_buffer->list_sector_[i].index_end - (track_buffer->list_sector_[i].
                        dam_offset + (3 * 16))) / 16;
                  }
               }
               else
               {
                  // Last track : go until begining of first sector
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - track_buffer->list_sector_[i]
                     .dam_offset + 0x24 + track_buffer->list_sector_[0].idam_offset + 64) / 16);
               }
            }
            if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
            {
               whole_track_recorded = true;
            }
         }
         finalsize += track_buffer->list_sector_[i].real_size;

         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += trackIn->Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((finalsize & 0xFFFFFF00) < finalsize)
      {
         finalsize += 0x100;
      }
      track_buffer->full_size_ = finalsize;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return finalsize;
}